

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

void bcf_set_variant_types(bcf1_t *b)

{
  char *pcVar1;
  char **ppcVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  variant_t *pvVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  char cVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  
  if ((b->unpacked & 1) == 0) {
    bcf_unpack(b,1);
  }
  uVar9 = *(ulong *)&b->field_0x10;
  uVar8 = (uint)(uVar9 >> 0x10) & 0xffff;
  if ((b->d).n_var < (int)uVar8) {
    pvVar6 = (variant_t *)realloc((b->d).var,(ulong)(uVar8 << 3));
    (b->d).var = pvVar6;
    uVar9 = *(ulong *)&b->field_0x10;
    (b->d).n_var = (uint)(uVar9 >> 0x10) & 0xffff;
  }
  (b->d).var_type = 0;
  uVar15 = 1;
  uVar8 = 0;
  do {
    if ((uVar9 >> 0x10 & 0xffff) <= uVar15) {
      return;
    }
    ppcVar2 = (b->d).allele;
    pvVar6 = (b->d).var;
    pcVar18 = *ppcVar2;
    pcVar3 = ppcVar2[uVar15];
    if ((pcVar18[1] == '\0') && (pcVar3[1] == '\0')) {
      cVar14 = *pcVar3;
      if (((cVar14 == '.') || (*pcVar18 == cVar14)) || (cVar14 == 'X')) goto LAB_0011b6f5;
LAB_0011b754:
      pvVar6[uVar15].type = 1;
      pvVar6[uVar15].n = 1;
      uVar13 = 1;
    }
    else if (*pcVar3 == '<') {
      if ((pcVar3[1] == 'X') && (pcVar3[2] == '>')) {
LAB_0011b6f5:
        pvVar6[uVar15].type = 0;
        pvVar6[uVar15].n = 0;
        uVar13 = 0;
      }
      else {
LAB_0011b5e9:
        pvVar6[uVar15].type = 8;
        uVar13 = 8;
      }
    }
    else {
      pcVar12 = pcVar18 + -1;
      pcVar17 = pcVar3 + -1;
      lVar16 = 0;
      lVar10 = 0;
LAB_0011b605:
      cVar14 = pcVar3[lVar16];
      if (*pcVar18 != '\0') {
        if (*pcVar18 == cVar14) break;
        if (cVar14 == '\0') {
          lVar10 = 0;
          do {
            pcVar3 = pcVar18 + lVar10;
            lVar10 = lVar10 + 1;
          } while (*pcVar3 != '\0');
          pvVar6[uVar15].n = 1 - (int)lVar10;
          goto LAB_0011b71c;
        }
        lVar4 = 0;
        do {
          lVar11 = lVar4;
          pcVar1 = pcVar12 + 2;
          pcVar12 = pcVar12 + 1;
          lVar4 = lVar11 + -1;
        } while (*pcVar1 != '\0');
        lVar4 = 1;
        do {
          lVar7 = lVar4;
          pcVar1 = pcVar17 + 2;
          pcVar17 = pcVar17 + 1;
          lVar4 = lVar7 + 1;
        } while (*pcVar1 != '\0');
        for (; ((pcVar18 < pcVar12 && (*pcVar12 == *pcVar17)) && (pcVar3 + -lVar10 < pcVar17));
            pcVar17 = pcVar17 + -1) {
          pcVar12 = pcVar12 + -1;
          lVar11 = lVar11 + 1;
          lVar7 = lVar7 + -1;
        }
        if (lVar7 == 1) {
          if (lVar11 != 0) {
            pvVar6[uVar15].n = (int)lVar11;
            if (*pcVar12 != pcVar3[lVar16]) goto LAB_0011b5e9;
            goto LAB_0011b71c;
          }
          goto LAB_0011b754;
        }
        if (lVar11 == 0) {
          pvVar6[uVar15].n = (int)lVar7 + -1;
          if (*pcVar18 == *pcVar17) goto LAB_0011b71c;
          goto LAB_0011b5e9;
        }
        lVar10 = lVar7 + -1;
        uVar13 = 8;
        if (lVar10 == -lVar11) {
          uVar13 = 2;
        }
        pvVar6[uVar15].type = uVar13;
        iVar5 = (int)lVar7;
        if (-lVar10 != lVar11 && lVar10 <= -lVar11) {
          iVar5 = (int)lVar11 + -1;
        }
        pvVar6[uVar15].n = iVar5;
        goto LAB_0011b727;
      }
      if (cVar14 == '\0') goto LAB_0011b6f5;
      lVar10 = 0;
      cVar14 = '\x01';
      while (cVar14 != '\0') {
        lVar4 = lVar10 + lVar16 + 1;
        lVar10 = lVar10 + 1;
        cVar14 = pcVar3[lVar4];
      }
      pvVar6[uVar15].n = (int)lVar10;
LAB_0011b71c:
      pvVar6[uVar15].type = 4;
      uVar13 = 4;
    }
LAB_0011b727:
    uVar8 = uVar8 | uVar13;
    (b->d).var_type = uVar8;
    uVar15 = uVar15 + 1;
    uVar9 = *(ulong *)&b->field_0x10;
  } while( true );
  pcVar18 = pcVar18 + 1;
  lVar10 = lVar10 + -1;
  lVar16 = lVar16 + 1;
  pcVar12 = pcVar12 + 1;
  pcVar17 = pcVar17 + 1;
  goto LAB_0011b605;
}

Assistant:

static void bcf_set_variant_types(bcf1_t *b)
{
    if ( !(b->unpacked & BCF_UN_STR) ) bcf_unpack(b, BCF_UN_STR);
    bcf_dec_t *d = &b->d;
    if ( d->n_var < b->n_allele )
    {
        d->var = (variant_t *) realloc(d->var, sizeof(variant_t)*b->n_allele);
        d->n_var = b->n_allele;
    }
    int i;
    b->d.var_type = 0;
    for (i=1; i<b->n_allele; i++)
    {
        bcf_set_variant_type(d->allele[0],d->allele[i], &d->var[i]);
        b->d.var_type |= d->var[i].type;
        //fprintf(stderr,"[set_variant_type] %d   %s %s -> %d %d .. %d\n", b->pos+1,d->allele[0],d->allele[i],d->var[i].type,d->var[i].n, b->d.var_type);
    }
}